

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Schema __thiscall capnp::SchemaLoader::load(SchemaLoader *this,Reader *reader)

{
  RawSchema *pRVar1;
  Maybe<kj::_::Mutex::Waiter_&> local_18;
  
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffe0,this);
  pRVar1 = Impl::load((Impl *)(local_18.ptr)->prev,reader,false);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&stack0xffffffffffffffe0
            );
  return (Schema)&pRVar1->defaultBrand;
}

Assistant:

Schema SchemaLoader::load(const schema::Node::Reader& reader) {
  return Schema(&impl.lockExclusive()->get()->load(reader, false)->defaultBrand);
}